

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadNeededValues.hpp
# Opt level: O3

void TasGrid::loadNeededValues<true,true>
               (function<void_(const_double_*,_double_*,_unsigned_long)> *model,
               TasmanianSparseGrid *grid,size_t num_threads)

{
  int iVar1;
  pointer ptVar2;
  runtime_error *this;
  thread *w;
  size_t sVar3;
  pointer ptVar4;
  pointer __args_1;
  size_t sVar5;
  size_t thread_id;
  pointer __args;
  size_type __n;
  long lVar6;
  vector<double,_std::allocator<double>_> values;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  vector<double,_std::allocator<double>_> points;
  Wrapper2D<double> ywrap;
  Wrapper2D<double> xwrap;
  mutex checked_out_lock;
  int local_13c;
  function<void_(const_double_*,_double_*,_unsigned_long)> *local_138;
  vector<double,_std::allocator<double>_> local_130;
  vector<std::thread,_std::allocator<std::thread>_> local_118;
  TasmanianSparseGrid *local_f8;
  vector<double,_std::allocator<double>_> local_f0;
  Wrapper2D<double> local_d8;
  Wrapper2D<double> local_c8;
  anon_class_56_7_dc8e8c63_for__M_head_impl local_b8;
  vector<bool,_std::allocator<bool>_> local_80;
  __native_type local_58;
  
  lVar6 = *(long *)(grid + 8);
  local_138 = model;
  if (lVar6 == 0) {
    if (grid[0x70] == (TasmanianSparseGrid)0x1) goto LAB_0010e192;
  }
  else {
    sVar3 = (size_t)*(int *)(lVar6 + 0x14);
    iVar1 = *(int *)(lVar6 + 0x20);
    __n = (size_type)iVar1;
    local_13c = 0;
    if (sVar3 != 0) {
      local_13c = iVar1;
    }
    if (grid[0x70] != (TasmanianSparseGrid)0x0) {
LAB_0010e192:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,
                 "ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true");
      goto LAB_0010e1cc;
    }
    if (*(int *)(lVar6 + 0x14) != 0) {
      if (iVar1 != 0) {
        if (*(int *)(lVar6 + 0x48) != 0) {
          TasGrid::TasmanianSparseGrid::clearRefinement();
        }
        TasmanianSparseGrid::getLoadedPoints(&local_f0,grid);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_130,__n * sVar3,(allocator_type *)&local_b8);
        if (*(long *)(grid + 8) == 0) {
          sVar5 = 0;
        }
        else {
          sVar5 = (size_t)*(int *)(*(long *)(grid + 8) + 0x10);
        }
        local_c8.data =
             local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_d8.data =
             local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_f8 = grid;
        local_d8.stride = sVar3;
        local_c8.stride = sVar5;
        if (num_threads == 0) {
          if (0 < iVar1) {
            lVar6 = 0;
            __args_1 = local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            __args = local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              std::function<void_(const_double_*,_double_*,_unsigned_long)>::operator()
                        (local_138,__args,__args_1,0);
              lVar6 = lVar6 + 1;
              __args_1 = __args_1 + sVar3;
              __args = __args + sVar5;
            } while (lVar6 < (long)__n);
          }
        }
        else {
          local_b8.thread_id = local_b8.thread_id & 0xffffffffffffff00;
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_80,__n,(bool *)&local_b8,(allocator_type *)&local_58.__data);
          local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
          local_58._16_8_ = 0;
          local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
          local_58.__align = 0;
          local_58._8_8_ = 0;
          local_118.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_118.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_118.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&local_118,num_threads);
          sVar3 = 0;
          do {
            local_b8.checked_out_lock = (mutex *)&local_58;
            local_b8.checked_out = &local_80;
            local_b8.model = local_138;
            local_b8.thread_id = sVar3;
            local_b8.num_points = &local_13c;
            local_b8.xwrap = &local_c8;
            local_b8.ywrap = &local_d8;
            std::vector<std::thread,std::allocator<std::thread>>::
            emplace_back<TasGrid::loadNeededValues<true,true>(std::function<void(double_const*,double*,unsigned_long)>,TasGrid::TasmanianSparseGrid&,unsigned_long)::_lambda()_1_>
                      ((vector<std::thread,std::allocator<std::thread>> *)&local_118,&local_b8);
            ptVar2 = local_118.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_finish;
            sVar3 = sVar3 + 1;
            ptVar4 = local_118.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                     .super__Vector_impl_data._M_start;
          } while (num_threads != sVar3);
          for (; ptVar4 != ptVar2; ptVar4 = ptVar4 + 1) {
            std::thread::join();
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_118);
          if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage -
                            (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          }
        }
        TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)local_f8);
        if (local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_130.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_130.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
      }
      return;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,"ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
LAB_0010e1cc:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void loadNeededValues(std::function<void(double const x[], double y[], size_t thread_id)> model, TasmanianSparseGrid &grid, size_t num_threads){
    int num_points = (overwrite_loaded) ? grid.getNumLoaded() : grid.getNumNeeded();
    int num_outputs = grid.getNumOutputs();
    if (grid.isUsingConstruction()) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true");
    if (num_outputs == 0) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
    if (num_points == 0) return; // nothing to do here
    if (overwrite_loaded && (grid.getNumNeeded() != 0)) grid.clearRefinement(); // using loaded points only, clear the refinement

    // get the points and values
    auto points = (overwrite_loaded) ? grid.getLoadedPoints() : grid.getNeededPoints();
    std::vector<double> values(Utils::size_mult(num_points, num_outputs));

    // divide logically into strips
    Utils::Wrapper2D<double> xwrap(grid.getNumDimensions(), points.data());
    Utils::Wrapper2D<double> ywrap(num_outputs, values.data());

    if (parallel_construction && (num_threads > 0)){
        std::vector<bool> checked_out(num_points, false);
        std::mutex checked_out_lock;

        std::vector<std::thread> workers;
        workers.reserve(num_threads);
        for(size_t thread_id=0; thread_id<num_threads; thread_id++){
            workers.emplace_back( // create a new worker thread
                [&, thread_id](void)->void{
                    int sample = 0;
                    do{
                        { // find the next sample
                            std::lock_guard<std::mutex> lock(checked_out_lock);
                            while ((sample < num_points) && checked_out[sample]) sample++;
                            if (sample < num_points) checked_out[sample] = true;
                        }
                        if (sample < num_points) // if found, compute the next sample
                            model(xwrap.getStrip(sample), ywrap.getStrip(sample), thread_id);
                    }while(sample < num_points);
                }
            );
        }

        for(auto &w : workers) w.join(); // wait till finished

    }else{
        for(int i=0; i<num_points; i++)
            model(xwrap.getStrip(i), ywrap.getStrip(i), 0);
    }

    grid.loadNeededPoints(values);
}